

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::SliceLayerParams::SliceLayerParams
          (SliceLayerParams *this,SliceLayerParams *from)

{
  void *pvVar1;
  int64 iVar2;
  int64 iVar3;
  undefined8 uVar4;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__SliceLayerParams_0040dbb0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  iVar2 = from->startindex_;
  iVar3 = from->endindex_;
  uVar4 = *(undefined8 *)((long)&from->stride_ + 4);
  *(undefined8 *)((long)&this->endindex_ + 4) = *(undefined8 *)((long)&from->endindex_ + 4);
  *(undefined8 *)((long)&this->stride_ + 4) = uVar4;
  this->startindex_ = iVar2;
  this->endindex_ = iVar3;
  return;
}

Assistant:

SliceLayerParams::SliceLayerParams(const SliceLayerParams& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::memcpy(&startindex_, &from.startindex_,
    reinterpret_cast<char*>(&axis_) -
    reinterpret_cast<char*>(&startindex_) + sizeof(axis_));
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.SliceLayerParams)
}